

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# QPDFFormFieldObjectHelper.cc
# Opt level: O0

string * __thiscall
QPDFFormFieldObjectHelper::getInheritableFieldValueAsName
          (string *__return_storage_ptr__,QPDFFormFieldObjectHelper *this,string *name)

{
  bool bVar1;
  string local_68;
  undefined1 local_31;
  QPDFObjectHandle fv;
  string *name_local;
  QPDFFormFieldObjectHelper *this_local;
  string *result;
  
  fv.super_BaseHandle.obj.super___shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
  _M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)name;
  getInheritableFieldValue((QPDFFormFieldObjectHelper *)&stack0xffffffffffffffd0,(string *)this);
  local_31 = 0;
  std::__cxx11::string::string((string *)__return_storage_ptr__);
  bVar1 = QPDFObjectHandle::isName((QPDFObjectHandle *)&stack0xffffffffffffffd0);
  if (bVar1) {
    QPDFObjectHandle::getName_abi_cxx11_(&local_68,(QPDFObjectHandle *)&stack0xffffffffffffffd0);
    std::__cxx11::string::operator=((string *)__return_storage_ptr__,(string *)&local_68);
    std::__cxx11::string::~string((string *)&local_68);
  }
  local_31 = 1;
  QPDFObjectHandle::~QPDFObjectHandle((QPDFObjectHandle *)&stack0xffffffffffffffd0);
  return __return_storage_ptr__;
}

Assistant:

std::string
QPDFFormFieldObjectHelper::getInheritableFieldValueAsName(std::string const& name)
{
    QPDFObjectHandle fv = getInheritableFieldValue(name);
    std::string result;
    if (fv.isName()) {
        result = fv.getName();
    }
    return result;
}